

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O3

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gls::fboc::details::AttachmentParams>::ParamTest
          (ParamTest<deqp::gls::fboc::details::AttachmentParams> *this,Context *ctx,Params *params)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  AttachmentParams *params_00;
  string local_58;
  string local_38;
  
  AttachmentParams::getName_abi_cxx11_(&local_38,params,params);
  AttachmentParams::getName_abi_cxx11_(&local_58,params,params_00);
  tcu::TestCase::TestCase
            ((TestCase *)this,ctx->m_testCtx,local_38._M_dataplus._M_p,local_58._M_dataplus._M_p);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02184d28;
  (this->super_TestBase).m_ctx = ctx;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02184fb0;
  GVar1 = params->colornKind;
  GVar2 = params->depthKind;
  GVar3 = params->stencilKind;
  (this->m_params).color0Kind = params->color0Kind;
  (this->m_params).colornKind = GVar1;
  (this->m_params).depthKind = GVar2;
  (this->m_params).stencilKind = GVar3;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}